

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

bool __thiscall cmArchiveWrite::AddFile(cmArchiveWrite *this,char *file,size_t skip,char *prefix)

{
  archive *paVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  archive_entry *paVar5;
  ulong uVar6;
  char *pcVar7;
  size_t size_00;
  char *local_120;
  size_t size;
  time_t local_e0;
  time_t t;
  time_t now;
  string local_c8;
  allocator local_a1;
  string local_a0;
  Entry local_80;
  Entry e;
  allocator local_61;
  undefined1 local_60 [8];
  string dest;
  cmLocaleRAII localeRAII;
  char *out;
  char *prefix_local;
  size_t skip_local;
  char *file_local;
  cmArchiveWrite *this_local;
  
  sVar3 = strlen(file);
  if (sVar3 <= skip) {
    return true;
  }
  cmLocaleRAII::cmLocaleRAII((cmLocaleRAII *)((long)&dest.field_2 + 8));
  local_120 = prefix;
  if (prefix == (char *)0x0) {
    local_120 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_60,local_120,&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::operator+=((string *)local_60,file + skip);
  if ((this->Verbose & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_60);
    std::operator<<(poVar4,"\n");
  }
  Entry::Entry(&local_80);
  paVar5 = Entry::operator_cast_to_archive_entry_(&local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,file,&local_a1);
  cm_archive_entry_copy_sourcepath(paVar5,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  paVar5 = Entry::operator_cast_to_archive_entry_(&local_80);
  cm_archive_entry_copy_pathname(paVar5,(string *)local_60);
  paVar1 = this->Disk;
  paVar5 = Entry::operator_cast_to_archive_entry_(&local_80);
  iVar2 = archive_read_disk_entry_from_file(paVar1,paVar5,-1,(stat *)0x0);
  if (iVar2 == 0) {
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      time(&t);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      local_e0 = cm_get_date(t,pcVar7);
      if (local_e0 == -1) {
        std::__cxx11::string::operator=((string *)&this->Error,"unable to parse mtime \'");
        std::__cxx11::string::operator+=((string *)&this->Error,(string *)&this->MTime);
        std::__cxx11::string::operator+=((string *)&this->Error,"\'");
        this_local._7_1_ = false;
        goto LAB_0059fe21;
      }
      paVar5 = Entry::operator_cast_to_archive_entry_(&local_80);
      archive_entry_set_mtime(paVar5,local_e0,0);
    }
    paVar5 = Entry::operator_cast_to_archive_entry_(&local_80);
    archive_entry_acl_clear(paVar5);
    paVar5 = Entry::operator_cast_to_archive_entry_(&local_80);
    archive_entry_xattr_clear(paVar5);
    paVar5 = Entry::operator_cast_to_archive_entry_(&local_80);
    archive_entry_set_fflags(paVar5,0,0);
    paVar1 = this->Archive;
    paVar5 = Entry::operator_cast_to_archive_entry_(&local_80);
    iVar2 = archive_write_header(paVar1,paVar5);
    if (iVar2 == 0) {
      paVar5 = Entry::operator_cast_to_archive_entry_(&local_80);
      pcVar7 = archive_entry_symlink(paVar5);
      if (pcVar7 == (char *)0x0) {
        paVar5 = Entry::operator_cast_to_archive_entry_(&local_80);
        size_00 = archive_entry_size(paVar5);
        if (size_00 != 0) {
          this_local._7_1_ = AddData(this,file,size_00);
          goto LAB_0059fe21;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Error,"archive_write_header: ");
      cm_archive_error_string_abi_cxx11_((string *)&size,this->Archive);
      std::__cxx11::string::operator+=((string *)&this->Error,(string *)&size);
      std::__cxx11::string::~string((string *)&size);
      this_local._7_1_ = false;
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&this->Error,"archive_read_disk_entry_from_file \'");
    std::__cxx11::string::operator+=((string *)&this->Error,file);
    std::__cxx11::string::operator+=((string *)&this->Error,"\': ");
    cm_archive_error_string_abi_cxx11_(&local_c8,this->Disk);
    std::__cxx11::string::operator+=((string *)&this->Error,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    this_local._7_1_ = false;
  }
LAB_0059fe21:
  now._4_4_ = 1;
  Entry::~Entry(&local_80);
  std::__cxx11::string::~string((string *)local_60);
  cmLocaleRAII::~cmLocaleRAII((cmLocaleRAII *)((long)&dest.field_2 + 8));
  return this_local._7_1_;
}

Assistant:

bool cmArchiveWrite::AddFile(const char* file,
                             size_t skip, const char* prefix)
{
  // Skip the file if we have no name for it.  This may happen on a
  // top-level directory, which does not need to be included anyway.
  if(skip >= strlen(file))
    {
    return true;
    }
  const char* out = file + skip;

  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);

  // Meta-data.
  std::string dest = prefix? prefix : "";
  dest += out;
  if(this->Verbose)
    {
    std::cout << dest << "\n";
    }
  Entry e;
  cm_archive_entry_copy_sourcepath(e, file);
  cm_archive_entry_copy_pathname(e, dest);
  if(archive_read_disk_entry_from_file(this->Disk, e, -1, 0) != ARCHIVE_OK)
    {
    this->Error = "archive_read_disk_entry_from_file '";
    this->Error += file;
    this->Error += "': ";
    this->Error += cm_archive_error_string(this->Disk);
    return false;
    }
  if (!this->MTime.empty())
    {
    time_t now;
    time(&now);
    time_t t = cm_get_date(now, this->MTime.c_str());
    if (t == -1)
      {
      this->Error = "unable to parse mtime '";
      this->Error += this->MTime;
      this->Error += "'";
      return false;
      }
    archive_entry_set_mtime(e, t, 0);
    }
  // Clear acl and xattr fields not useful for distribution.
  archive_entry_acl_clear(e);
  archive_entry_xattr_clear(e);
  archive_entry_set_fflags(e, 0, 0);
  if(archive_write_header(this->Archive, e) != ARCHIVE_OK)
    {
    this->Error = "archive_write_header: ";
    this->Error += cm_archive_error_string(this->Archive);
    return false;
    }

  // do not copy content of symlink
  if (!archive_entry_symlink(e))
    {
    // Content.
    if(size_t size = static_cast<size_t>(archive_entry_size(e)))
      {
      return this->AddData(file, size);
      }
    }
  return true;
}